

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_CheckClass
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *pAVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar5;
  byte bVar6;
  PClass *pPVar7;
  bool bVar8;
  PClass *pPVar3;
  
  pPVar7 = AActor::RegistrationInfo.MyClass;
  if (numret < 1) {
    return 0;
  }
  if (ret == (VMReturn *)0x0) {
    __assert_fail("ret != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xff,
                  "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003c6012;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003c5fda:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003c6012:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x100,
                  "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar4 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar4 == (AActor *)0x0) goto LAB_003c5e6d;
    pPVar3 = (pAVar4->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(pAVar4->super_DThinker).super_DObject._vptr_DObject)(pAVar4);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (pAVar4->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar8 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar7 && bVar8) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar8 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar7) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar8) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003c6012;
    }
  }
  else {
    if (pAVar4 != (AActor *)0x0) goto LAB_003c5fda;
LAB_003c5e6d:
    pAVar4 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003c6031;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003c5fe3:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003c6031:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x101,
                  "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pPVar7 = (PClass *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (pPVar7 == (PClass *)0x0) goto LAB_003c5ece;
    pPVar3 = pPVar7;
    if (pPVar7 != AActor::RegistrationInfo.MyClass) {
      do {
        pPVar3 = pPVar3->ParentClass;
        if (pPVar3 == AActor::RegistrationInfo.MyClass) break;
      } while (pPVar3 != (PClass *)0x0);
      if (pPVar3 == (PClass *)0x0) {
        pcVar5 = "checktype == NULL || checktype->IsDescendantOf(RUNTIME_CLASS(AActor))";
        goto LAB_003c6031;
      }
    }
    bVar6 = 0;
  }
  else {
    if (pPVar7 != (PClass *)0x0) goto LAB_003c5fe3;
LAB_003c5ece:
    bVar6 = 1;
    pPVar7 = (PClass *)0x0;
  }
  if (numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003c6078;
    }
    iVar2 = param[2].field_0.i;
LAB_003c5f04:
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003c6097:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x103,
                    "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
LAB_003c6078:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x102,
                    "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar2 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003c5f04;
    }
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003c6097;
    }
  }
  iVar1 = param[3].field_0.i;
  pAVar4 = COPY_AAPTR(pAVar4,iVar2);
  if ((bool)(~bVar6 & pAVar4 != (AActor *)0x0)) {
    pPVar3 = (pAVar4->super_DThinker).super_DObject.Class;
    if (iVar1 == 0) {
      if (pPVar3 == (PClass *)0x0) {
        iVar2 = (**(pAVar4->super_DThinker).super_DObject._vptr_DObject)(pAVar4);
        pPVar3 = (PClass *)CONCAT44(extraout_var_01,iVar2);
        (pAVar4->super_DThinker).super_DObject.Class = pPVar3;
      }
      if (ret->RegType != '\0') goto LAB_003c6049;
      bVar8 = pPVar3 == pPVar7;
    }
    else {
      if (pPVar3 == (PClass *)0x0) {
        iVar2 = (**(pAVar4->super_DThinker).super_DObject._vptr_DObject)(pAVar4);
        pPVar3 = (PClass *)CONCAT44(extraout_var_00,iVar2);
        (pAVar4->super_DThinker).super_DObject.Class = pPVar3;
      }
      bVar8 = pPVar3 != (PClass *)0x0;
      if (pPVar3 != pPVar7 && bVar8) {
        do {
          pPVar3 = pPVar3->ParentClass;
          bVar8 = pPVar3 != (PClass *)0x0;
          if (pPVar3 == pPVar7) break;
        } while (pPVar3 != (PClass *)0x0);
      }
      if (ret->RegType != '\0') {
LAB_003c6049:
        __assert_fail("RegType == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                      ,0x13f,"void VMReturn::SetInt(int)");
      }
    }
  }
  else {
    if (ret->RegType != '\0') goto LAB_003c6049;
    bVar8 = false;
  }
  *(uint *)ret->Location = (uint)bVar8;
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckClass)
{
	if (numret > 0)
	{
		assert(ret != NULL);
		PARAM_SELF_PROLOGUE(AActor);
		PARAM_CLASS		(checktype, AActor);
		PARAM_INT_DEF	(pick_pointer);
		PARAM_BOOL_DEF	(match_superclass);

		self = COPY_AAPTR(self, pick_pointer);
		if (self == nullptr || checktype == nullptr)
		{
			ret->SetInt(false);
		}
		else if (match_superclass)
		{
			ret->SetInt(self->IsKindOf(checktype));
		}
		else
		{
			ret->SetInt(self->GetClass() == checktype);
		}
		return 1;
	}
	return 0;
}